

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scheduler_tests.cpp
# Opt level: O0

void scheduler_tests::microTask
               (CScheduler *s,mutex *mutex,int *counter,int delta,time_point rescheduleTime)

{
  bool bVar1;
  int in_ECX;
  CScheduler *in_RDX;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *in_RSI;
  function<void_()> *in_RDI;
  long in_FS_OFFSET;
  Function f;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  noTime;
  lock_guard<std::mutex> lock;
  lock_guard<std::mutex> *in_stack_fffffffffffffee8;
  function<void_()> *this;
  CScheduler *in_stack_fffffffffffffef0;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *in_stack_fffffffffffffef8;
  reference_wrapper<std::mutex> *in_stack_ffffffffffffff00;
  _Bind<void_(*(std::reference_wrapper<CScheduler>,_std::reference_wrapper<std::mutex>,_std::reference_wrapper<int>,_int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>))(CScheduler_&,_std::mutex_&,_int_&,_int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>)>
  *__f;
  function<void_()> *in_stack_ffffffffffffff08;
  _func_void_CScheduler_ptr_mutex_ptr_int_ptr_int_time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  **in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff20;
  time_point in_stack_ffffffffffffff58;
  reference_wrapper<int> local_70 [6];
  undefined1 local_40 [32];
  function<void_()> local_20;
  
  local_20._M_invoker = *(_Invoker_type *)(in_FS_OFFSET + 0x28);
  std::lock_guard<std::mutex>::lock_guard(in_stack_fffffffffffffee8,(mutex_type *)0x9de949);
  *(int *)&(in_RDX->m_service_thread)._M_id._M_thread =
       in_ECX + (int)(in_RDX->m_service_thread)._M_id._M_thread;
  std::lock_guard<std::mutex>::~lock_guard(in_stack_fffffffffffffee8);
  local_20.super__Function_base._M_functor._M_unused._0_8_ =
       (undefined8)
       std::chrono::
       time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
       ::min();
  bVar1 = std::chrono::operator==
                    (in_stack_fffffffffffffef8,
                     (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                      *)in_stack_fffffffffffffef0);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    std::ref<CScheduler>(in_stack_fffffffffffffef0);
    std::ref<std::mutex>((mutex *)in_stack_fffffffffffffef0);
    std::ref<int>((int *)in_stack_fffffffffffffef0);
    this = &local_20;
    std::
    bind<void(*)(CScheduler&,std::mutex&,int&,int,std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>),std::reference_wrapper<CScheduler>,std::reference_wrapper<std::mutex>,std::reference_wrapper<int>,int,std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>&>
              (in_stack_ffffffffffffff10,(reference_wrapper<CScheduler> *)in_stack_ffffffffffffff08,
               in_stack_ffffffffffffff00,local_70,(int *)in_stack_fffffffffffffef0,in_RSI);
    __f = (_Bind<void_(*(std::reference_wrapper<CScheduler>,_std::reference_wrapper<std::mutex>,_std::reference_wrapper<int>,_int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>))(CScheduler_&,_std::mutex_&,_int_&,_int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>)>
           *)local_40;
    std::function<void()>::
    function<std::_Bind<void(*(std::reference_wrapper<CScheduler>,std::reference_wrapper<std::mutex>,std::reference_wrapper<int>,int,std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>))(CScheduler&,std::mutex&,int&,int,std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>)>,void>
              (in_stack_ffffffffffffff08,__f);
    std::function<void_()>::function(in_RDI,(function<void_()> *)__f);
    CScheduler::schedule
              (in_RDX,(Function *)CONCAT44(in_ECX,in_stack_ffffffffffffff20),
               in_stack_ffffffffffffff58);
    std::function<void_()>::~function(this);
    std::function<void_()>::~function(this);
  }
  if (*(_Invoker_type *)(in_FS_OFFSET + 0x28) != local_20._M_invoker) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void microTask(CScheduler& s, std::mutex& mutex, int& counter, int delta, std::chrono::steady_clock::time_point rescheduleTime)
{
    {
        std::lock_guard<std::mutex> lock(mutex);
        counter += delta;
    }
    auto noTime = std::chrono::steady_clock::time_point::min();
    if (rescheduleTime != noTime) {
        CScheduler::Function f = std::bind(&microTask, std::ref(s), std::ref(mutex), std::ref(counter), -delta + 1, noTime);
        s.schedule(f, rescheduleTime);
    }
}